

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O0

void __thiscall GenericModelItem::insertRows(GenericModelItem *this,int row,int count)

{
  int iVar1;
  bool bVar2;
  iterator o;
  GenericModelItem **ppGVar3;
  GenericModelItem *this_00;
  reference ppGVar4;
  GenericModelItem *newChild;
  int i_1;
  iterator iEnd;
  iterator local_20;
  enable_if_t<std::is_integral_v<int>,_iterator> i;
  int count_local;
  int row_local;
  GenericModelItem *this_local;
  
  i.i._0_4_ = count;
  if (0 < this->m_colCount) {
    i.i._4_4_ = row;
    iEnd = QList<GenericModelItem_*>::begin(&this->children);
    local_20.i = (GenericModelItem **)
                 QList<GenericModelItem*>::iterator::operator+
                           ((iterator *)&iEnd,i.i._4_4_ * this->m_colCount);
    o = QList<GenericModelItem_*>::end(&this->children);
    while (bVar2 = QList<GenericModelItem_*>::iterator::operator!=(&local_20,o), iVar1 = (int)i.i,
          bVar2) {
      ppGVar3 = QList<GenericModelItem_*>::iterator::operator*(&local_20);
      (*ppGVar3)->m_row = iVar1 + (*ppGVar3)->m_row;
      QList<GenericModelItem_*>::iterator::operator++(&local_20);
    }
    QList<GenericModelItem_*>::insert
              (&this->children,(long)(i.i._4_4_ * this->m_colCount),
               (long)((int)i.i * this->m_colCount),(parameter_type)0x0);
    for (newChild._4_4_ = i.i._4_4_ * this->m_colCount;
        newChild._4_4_ < (i.i._4_4_ + (int)i.i) * this->m_colCount;
        newChild._4_4_ = newChild._4_4_ + 1) {
      this_00 = (GenericModelItem *)operator_new(0x58);
      GenericModelItem(this_00,this);
      this_00->m_column = newChild._4_4_ % this->m_colCount;
      this_00->m_row = newChild._4_4_ / this->m_colCount;
      ppGVar4 = QList<GenericModelItem_*>::operator[](&this->children,(long)newChild._4_4_);
      *ppGVar4 = this_00;
    }
  }
  this->m_rowCount = (int)i.i + this->m_rowCount;
  return;
}

Assistant:

void GenericModelItem::insertRows(int row, int count)
{
    if (m_colCount > 0) {
        for (auto i = children.begin() + (row * m_colCount), iEnd = children.end(); i != iEnd; ++i)
            (*i)->m_row += count;
        children.insert(row * m_colCount, count * m_colCount, nullptr);
        for (int i = row * m_colCount; i < (row + count) * m_colCount; ++i) {
            auto newChild = new GenericModelItem(this);
            newChild->m_column = i % m_colCount;
            newChild->m_row = i / m_colCount;
            children[i] = newChild;
        }
    }
    m_rowCount += count;
#ifdef QT_DEBUG
    Q_ASSERT(m_colCount * m_rowCount == children.size());
    for (int i = 0; i < children.size(); ++i) {
        Q_ASSERT(children.at(i)->row() == i / m_colCount);
        Q_ASSERT(children.at(i)->column() == i % m_colCount);
    }
#endif
}